

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O2

list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *
Liby::Resolver::resolve
          (list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *__return_storage_ptr__,
          string *host,string *service)

{
  addrinfo *info;
  int iVar1;
  addrinfo **__pai;
  addrinfo *ailist;
  addrinfo *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  (__return_storage_ptr__->super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>).
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>).
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>).
  _M_impl._M_node._M_size = 0;
  __pai = &local_60;
  iVar1 = getaddrinfo((host->_M_dataplus)._M_p,(service->_M_dataplus)._M_p,(addrinfo *)0x0,
                      (addrinfo **)__pai);
  if (iVar1 == 0) {
    local_38._8_8_ = 0;
    local_38._M_unused._M_object = local_60;
    local_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Resolver.cpp:102:28)>
               ::_M_invoke;
    local_58._M_unused._M_object = local_60;
    local_58._8_8_ = 0;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Resolver.cpp:102:28)>
               ::_M_manager;
    local_28 = 0;
    uStack_20 = 0;
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    while (info = *__pai, info != (addrinfo *)0x0) {
      Endpoint::Endpoint((Endpoint *)&local_38,info);
      std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::push_back
                (__return_storage_ptr__,(value_type *)&local_38);
      __pai = &info->ai_next;
    }
    DeferCaller::~DeferCaller((DeferCaller *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<Endpoint> Resolver::resolve(const std::string &host,
                                      const std::string &service) {
    struct addrinfo *ailist;
    std::list<Endpoint> ret;

    int err = ::getaddrinfo(host.data(), service.data(), nullptr, &ailist);
    if (err != 0) {
        ; // throw err string
    } else {
        DeferCaller caller([ailist] { ::freeaddrinfo(ailist); });

        struct addrinfo *aip = ailist;
        for (; aip != NULL; aip = aip->ai_next) {
            ret.push_back(Endpoint(aip));
        }
    }
    return ret;
}